

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testCompositeDeepScanLine.cpp
# Opt level: O3

void __thiscall
anon_unknown.dwarf_84eae::test_parts<float>
          (anon_unknown_dwarf_84eae *this,int pattern_number,int number_of_parts,bool load_depths,
          bool entire_buffer,string *tempDir)

{
  undefined8 *puVar1;
  pointer *ppfVar2;
  pointer *ppuVar3;
  pointer *ppvVar4;
  int iVar5;
  int iVar6;
  pointer pvVar7;
  pointer pvVar8;
  bool bVar9;
  pointer pHVar10;
  _Alloc_hider _Var11;
  int iVar12;
  int iVar13;
  int iVar14;
  int iVar15;
  size_t sVar16;
  size_t sVar17;
  long lVar18;
  int *piVar19;
  ostream *poVar20;
  long *plVar21;
  undefined4 *puVar22;
  pointer pvVar23;
  size_type sVar24;
  DeepScanLineInputPart *this_00;
  Box2i *pBVar25;
  pointer pvVar26;
  data<float> *pdVar27;
  pointer *ppvVar28;
  data<float> *pdVar29;
  size_type __n;
  size_t s_1;
  ulong uVar30;
  long lVar31;
  long lVar32;
  pointer pbVar33;
  size_t i;
  string *psVar34;
  undefined7 in_register_00000081;
  float *pfVar35;
  ulong uVar36;
  data<float> *pdVar37;
  data<float> *pdVar38;
  ulong __n_00;
  ulong uVar39;
  long lVar40;
  data<float> main;
  vector<unsigned_int,_std::allocator<unsigned_int>_> counts;
  vector<Imf_3_2::Header,_std::allocator<Imf_3_2::Header>_> headers;
  vector<std::vector<float_*,_std::allocator<float_*>_>,_std::allocator<std::vector<float_*,_std::allocator<float_*>_>_>_>
  sample_pointers;
  vector<float,_std::allocator<float>_> data;
  vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
  sample_buffers;
  data<float> *local_220;
  bool local_214;
  string fn;
  vector<(anonymous_namespace)::data<float>,_std::allocator<(anonymous_namespace)::data<float>_>_>
  local_1e8;
  ulong local_1d0;
  ulong local_1c8;
  undefined1 local_1c0 [8];
  MultiPartOutputFile f;
  ostringstream s;
  undefined7 uStack_1a7;
  _Base_ptr local_1a0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_198;
  _Base_ptr *local_188;
  undefined8 local_180;
  Slice local_178 [64];
  ios_base local_138 [264];
  
  fn._M_dataplus._M_p = (pointer)&fn.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&fn,CONCAT71(in_register_00000081,entire_buffer),
             (long)&(tempDir->_M_dataplus)._M_p + CONCAT71(in_register_00000081,entire_buffer));
  std::__cxx11::string::append((char *)&fn);
  main._results.
  super__Vector_base<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage._0_2_ = 0;
  main._66_8_ = 0;
  main._results.
  super__Vector_base<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  main._results.
  super__Vector_base<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish._0_2_ = 0;
  main._results.
  super__Vector_base<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish._2_6_ = 0;
  main._current_result.super__Vector_base<float,_std::allocator<float>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  main._current_result.super__Vector_base<float,_std::allocator<float>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  main._channels.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  main._current_result.super__Vector_base<float,_std::allocator<float>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  main._channels.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  main._channels.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  main._current_sample.super__Vector_base<float,_std::allocator<float>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  main._current_sample.super__Vector_base<float,_std::allocator<float>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  main._current_sample.super__Vector_base<float,_std::allocator<float>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  main._current_pixel.
  super__Vector_base<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  main._current_pixel.
  super__Vector_base<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  main._current_pixel.
  super__Vector_base<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  main._samples.
  super__Vector_base<std::vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>,_std::allocator<std::vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  main._samples.
  super__Vector_base<std::vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>,_std::allocator<std::vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  main._samples.
  super__Vector_base<std::vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>,_std::allocator<std::vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  sVar16 = std::type_info::hash_code((type_info *)&float::typeinfo);
  sVar17 = std::type_info::hash_code((type_info *)&Imath_3_2::half::typeinfo);
  main._type = (sVar16 != sVar17) + HALF;
  _s = (pointer)&local_198;
  if ((int)this == 0) {
    local_198._M_allocated_capacity._0_2_ = 0x5a;
    local_1a0 = (_Base_ptr)0x1;
    data<float>::operator<<(&main,(string *)&s);
    ppfVar2 = &data.super__Vector_base<float,_std::allocator<float>_>._M_impl.
               super__Vector_impl_data._M_end_of_storage;
    data.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage =
         (pointer)CONCAT26(data.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                           super__Vector_impl_data._M_end_of_storage._6_2_,0x6b6361425a);
    data.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data._M_finish
         = (pointer)0x5;
    data.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data._M_start
         = (pointer)ppfVar2;
    data<float>::operator<<(&main,(string *)&data);
    ppuVar3 = &counts.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
               super__Vector_impl_data._M_end_of_storage;
    counts.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage._0_2_ = 0x41;
    counts.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x1;
    counts.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)ppuVar3;
    data<float>::operator<<(&main,(string *)&counts);
    ppvVar4 = &sample_pointers.
               super__Vector_base<std::vector<float_*,_std::allocator<float_*>_>,_std::allocator<std::vector<float_*,_std::allocator<float_*>_>_>_>
               ._M_impl.super__Vector_impl_data._M_end_of_storage;
    sample_pointers.
    super__Vector_base<std::vector<float_*,_std::allocator<float_*>_>,_std::allocator<std::vector<float_*,_std::allocator<float_*>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage._0_2_ = 0x52;
    sample_pointers.
    super__Vector_base<std::vector<float_*,_std::allocator<float_*>_>,_std::allocator<std::vector<float_*,_std::allocator<float_*>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x1;
    psVar34 = (string *)&sample_pointers;
    sample_pointers.
    super__Vector_base<std::vector<float_*,_std::allocator<float_*>_>,_std::allocator<std::vector<float_*,_std::allocator<float_*>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)ppvVar4;
    data<float>::operator<<(&main,psVar34);
    if (sample_pointers.
        super__Vector_base<std::vector<float_*,_std::allocator<float_*>_>,_std::allocator<std::vector<float_*,_std::allocator<float_*>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start != (pointer)ppvVar4) {
      psVar34 = (string *)
                (CONCAT62(sample_pointers.
                          super__Vector_base<std::vector<float_*,_std::allocator<float_*>_>,_std::allocator<std::vector<float_*,_std::allocator<float_*>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage._2_6_,
                          sample_pointers.
                          super__Vector_base<std::vector<float_*,_std::allocator<float_*>_>,_std::allocator<std::vector<float_*,_std::allocator<float_*>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage._0_2_) + 1);
      operator_delete(sample_pointers.
                      super__Vector_base<std::vector<float_*,_std::allocator<float_*>_>,_std::allocator<std::vector<float_*,_std::allocator<float_*>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start,(ulong)psVar34);
    }
    if ((pointer *)
        counts.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_start != ppuVar3) {
      psVar34 = (string *)
                (CONCAT62(counts.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage._2_6_,
                          counts.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage._0_2_) + 1);
      operator_delete(counts.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                      .super__Vector_impl_data._M_start,(ulong)psVar34);
    }
    if ((pointer *)
        data.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
        _M_start != ppfVar2) {
      psVar34 = (string *)
                ((long)data.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                       super__Vector_impl_data._M_end_of_storage + 1);
      operator_delete(data.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                      super__Vector_impl_data._M_start,(ulong)psVar34);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)_s != &local_198) {
      psVar34 = (string *)(local_198._M_allocated_capacity + 1);
      operator_delete(_s,(ulong)psVar34);
    }
    data<float>::operator<<(&main,1.0);
    data<float>::operator<<(&main,2.0);
    data<float>::operator<<(&main,0.0);
    data<float>::operator<<(&main,1.0);
    data<float>::operator<<(&main,(end *)psVar34);
    data<float>::operator<<(&main,2.1);
    data<float>::operator<<(&main,2.3);
    data<float>::operator<<(&main,0.5);
    data<float>::operator<<(&main,0.4);
    data<float>::operator<<(&main,(end *)psVar34);
    data<float>::operator<<(&main,(result *)psVar34);
    data<float>::operator<<(&main,3.1);
    data<float>::operator<<(&main,4.3);
    data<float>::operator<<(&main,0.5);
    data<float>::operator<<(&main,1.4);
    data<float>::operator<<(&main,(end *)psVar34);
    data<float>::operator<<(&main,10.0);
    data<float>::operator<<(&main,20.0);
    data<float>::operator<<(&main,1.0);
    data<float>::operator<<(&main,1.0);
    data<float>::operator<<(&main,(end *)psVar34);
    data<float>::operator<<(&main,20.0);
    data<float>::operator<<(&main,30.0);
    data<float>::operator<<(&main,1.0);
    data<float>::operator<<(&main,2.0);
    data<float>::operator<<(&main,(end *)psVar34);
    data<float>::operator<<(&main,(result *)psVar34);
    data<float>::operator<<(&main,10.0);
    data<float>::operator<<(&main,20.0);
    data<float>::operator<<(&main,1.0);
    data<float>::operator<<(&main,1.0);
    data<float>::operator<<(&main,(end *)psVar34);
    data<float>::operator<<(&main,(result *)psVar34);
    data<float>::operator<<(&main,0.0);
    data<float>::operator<<(&main,0.0);
    data<float>::operator<<(&main,0.0);
    data<float>::operator<<(&main,0.0);
    data<float>::operator<<(&main,(end *)psVar34);
  }
  else {
    local_198._M_allocated_capacity._0_2_ = 0x5a;
    local_1a0 = (_Base_ptr)0x1;
    data<float>::operator<<(&main,(string *)&s);
    ppfVar2 = &data.super__Vector_base<float,_std::allocator<float>_>._M_impl.
               super__Vector_impl_data._M_end_of_storage;
    data.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage =
         (pointer)CONCAT62(data.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                           super__Vector_impl_data._M_end_of_storage._2_6_,0x52);
    data.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data._M_finish
         = (pointer)0x1;
    data.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data._M_start
         = (pointer)ppfVar2;
    data<float>::operator<<(&main,(string *)&data);
    ppuVar3 = &counts.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
               super__Vector_impl_data._M_end_of_storage;
    counts.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage._0_2_ = 0x47;
    counts.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x1;
    counts.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)ppuVar3;
    data<float>::operator<<(&main,(string *)&counts);
    ppvVar4 = &sample_pointers.
               super__Vector_base<std::vector<float_*,_std::allocator<float_*>_>,_std::allocator<std::vector<float_*,_std::allocator<float_*>_>_>_>
               ._M_impl.super__Vector_impl_data._M_end_of_storage;
    sample_pointers.
    super__Vector_base<std::vector<float_*,_std::allocator<float_*>_>,_std::allocator<std::vector<float_*,_std::allocator<float_*>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage._0_2_ = 0x42;
    sample_pointers.
    super__Vector_base<std::vector<float_*,_std::allocator<float_*>_>,_std::allocator<std::vector<float_*,_std::allocator<float_*>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x1;
    sample_pointers.
    super__Vector_base<std::vector<float_*,_std::allocator<float_*>_>,_std::allocator<std::vector<float_*,_std::allocator<float_*>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)ppvVar4;
    data<float>::operator<<(&main,(string *)&sample_pointers);
    ppvVar28 = &sample_buffers.
                super__Vector_base<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage;
    sample_buffers.
    super__Vector_base<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage._0_2_ = 0x41;
    sample_buffers.
    super__Vector_base<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x1;
    psVar34 = (string *)&sample_buffers;
    sample_buffers.
    super__Vector_base<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)ppvVar28;
    data<float>::operator<<(&main,psVar34);
    if (sample_buffers.
        super__Vector_base<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start != (pointer)ppvVar28) {
      psVar34 = (string *)
                (CONCAT62(sample_buffers.
                          super__Vector_base<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage._2_6_,
                          sample_buffers.
                          super__Vector_base<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage._0_2_) + 1);
      operator_delete(sample_buffers.
                      super__Vector_base<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start,(ulong)psVar34);
    }
    if (sample_pointers.
        super__Vector_base<std::vector<float_*,_std::allocator<float_*>_>,_std::allocator<std::vector<float_*,_std::allocator<float_*>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start != (pointer)ppvVar4) {
      psVar34 = (string *)
                (CONCAT62(sample_pointers.
                          super__Vector_base<std::vector<float_*,_std::allocator<float_*>_>,_std::allocator<std::vector<float_*,_std::allocator<float_*>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage._2_6_,
                          sample_pointers.
                          super__Vector_base<std::vector<float_*,_std::allocator<float_*>_>,_std::allocator<std::vector<float_*,_std::allocator<float_*>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage._0_2_) + 1);
      operator_delete(sample_pointers.
                      super__Vector_base<std::vector<float_*,_std::allocator<float_*>_>,_std::allocator<std::vector<float_*,_std::allocator<float_*>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start,(ulong)psVar34);
    }
    if ((pointer *)
        counts.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_start != ppuVar3) {
      psVar34 = (string *)
                (CONCAT62(counts.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage._2_6_,
                          counts.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage._0_2_) + 1);
      operator_delete(counts.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                      .super__Vector_impl_data._M_start,(ulong)psVar34);
    }
    if ((pointer *)
        data.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
        _M_start != ppfVar2) {
      psVar34 = (string *)
                ((long)data.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                       super__Vector_impl_data._M_end_of_storage + 1);
      operator_delete(data.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                      super__Vector_impl_data._M_start,(ulong)psVar34);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)_s != &local_198) {
      psVar34 = (string *)(local_198._M_allocated_capacity + 1);
      operator_delete(_s,(ulong)psVar34);
    }
    data<float>::operator<<(&main,1.0);
    data<float>::operator<<(&main,0.4);
    data<float>::operator<<(&main,1.25);
    data<float>::operator<<(&main,-0.1);
    data<float>::operator<<(&main,0.7);
    data<float>::operator<<(&main,(end *)psVar34);
    data<float>::operator<<(&main,2.2);
    data<float>::operator<<(&main,0.2);
    data<float>::operator<<(&main,-0.1);
    data<float>::operator<<(&main,0.0);
    data<float>::operator<<(&main,0.24);
    data<float>::operator<<(&main,(end *)psVar34);
    data<float>::operator<<(&main,2.3);
    data<float>::operator<<(&main,0.9);
    data<float>::operator<<(&main,0.56);
    data<float>::operator<<(&main,2.26);
    data<float>::operator<<(&main,0.9);
    data<float>::operator<<(&main,(end *)psVar34);
    data<float>::operator<<(&main,5.0);
    data<float>::operator<<(&main,1.0);
    data<float>::operator<<(&main,0.5);
    data<float>::operator<<(&main,0.6);
    data<float>::operator<<(&main,0.2);
    data<float>::operator<<(&main,(end *)psVar34);
    data<float>::operator<<(&main,(result *)psVar34);
    data<float>::operator<<(&main,2.2984);
    data<float>::operator<<(&main,0.688);
    data<float>::operator<<(&main,1.35908);
    data<float>::operator<<(&main,0.42896);
    data<float>::operator<<(&main,0.9817);
    data<float>::operator<<(&main,(end *)psVar34);
    data<float>::operator<<(&main,1.0);
    data<float>::operator<<(&main,0.4);
    data<float>::operator<<(&main,1.25);
    data<float>::operator<<(&main,-0.1);
    data<float>::operator<<(&main,0.7);
    data<float>::operator<<(&main,(end *)psVar34);
    data<float>::operator<<(&main,2.2);
    data<float>::operator<<(&main,0.2);
    data<float>::operator<<(&main,-0.1);
    data<float>::operator<<(&main,0.0);
    data<float>::operator<<(&main,0.24);
    data<float>::operator<<(&main,(end *)psVar34);
    data<float>::operator<<(&main,2.3);
    data<float>::operator<<(&main,0.9);
    data<float>::operator<<(&main,0.56);
    data<float>::operator<<(&main,2.26);
    data<float>::operator<<(&main,0.9);
    data<float>::operator<<(&main,(end *)psVar34);
    data<float>::operator<<(&main,5.0);
    data<float>::operator<<(&main,1.0);
    data<float>::operator<<(&main,0.5);
    data<float>::operator<<(&main,0.6);
    data<float>::operator<<(&main,0.2);
    data<float>::operator<<(&main,(end *)psVar34);
    data<float>::operator<<(&main,11.0);
    data<float>::operator<<(&main,0.4);
    data<float>::operator<<(&main,1.25);
    data<float>::operator<<(&main,-0.1);
    data<float>::operator<<(&main,0.7);
    data<float>::operator<<(&main,(end *)psVar34);
    data<float>::operator<<(&main,12.2);
    data<float>::operator<<(&main,0.2);
    data<float>::operator<<(&main,-0.1);
    data<float>::operator<<(&main,0.0);
    data<float>::operator<<(&main,0.24);
    data<float>::operator<<(&main,(end *)psVar34);
    data<float>::operator<<(&main,12.3);
    data<float>::operator<<(&main,0.9);
    data<float>::operator<<(&main,0.56);
    data<float>::operator<<(&main,2.26);
    data<float>::operator<<(&main,0.9);
    data<float>::operator<<(&main,(end *)psVar34);
    data<float>::operator<<(&main,15.0);
    data<float>::operator<<(&main,1.0);
    data<float>::operator<<(&main,0.5);
    data<float>::operator<<(&main,0.6);
    data<float>::operator<<(&main,0.2);
    data<float>::operator<<(&main,(end *)psVar34);
    data<float>::operator<<(&main,(result *)psVar34);
    data<float>::operator<<(&main,2.62319);
    data<float>::operator<<(&main,0.7005);
    data<float>::operator<<(&main,1.38387);
    data<float>::operator<<(&main,0.43678);
    data<float>::operator<<(&main,0.99967);
    data<float>::operator<<(&main,(end *)psVar34);
    data<float>::operator<<(&main,27.0);
    data<float>::operator<<(&main,1.0);
    data<float>::operator<<(&main,-1.0);
    data<float>::operator<<(&main,42.0);
    data<float>::operator<<(&main,14.0);
    data<float>::operator<<(&main,(end *)psVar34);
    data<float>::operator<<(&main,(result *)psVar34);
    data<float>::operator<<(&main,27.0);
    data<float>::operator<<(&main,1.0);
    data<float>::operator<<(&main,-1.0);
    data<float>::operator<<(&main,42.0);
    data<float>::operator<<(&main,14.0);
    data<float>::operator<<(&main,(end *)psVar34);
    data<float>::operator<<(&main,1.0);
    data<float>::operator<<(&main,0.4);
    data<float>::operator<<(&main,1.25);
    data<float>::operator<<(&main,-0.1);
    data<float>::operator<<(&main,0.7);
    data<float>::operator<<(&main,(end *)psVar34);
    data<float>::operator<<(&main,2.2);
    data<float>::operator<<(&main,0.2);
    data<float>::operator<<(&main,-0.1);
    data<float>::operator<<(&main,0.0);
    data<float>::operator<<(&main,0.24);
    data<float>::operator<<(&main,(end *)psVar34);
    data<float>::operator<<(&main,2.3);
    data<float>::operator<<(&main,0.9);
    data<float>::operator<<(&main,0.56);
    data<float>::operator<<(&main,2.26);
    data<float>::operator<<(&main,0.9);
    data<float>::operator<<(&main,(end *)psVar34);
    data<float>::operator<<(&main,5.0);
    data<float>::operator<<(&main,1.0);
    data<float>::operator<<(&main,0.5);
    data<float>::operator<<(&main,0.6);
    data<float>::operator<<(&main,0.2);
    data<float>::operator<<(&main,(end *)psVar34);
    data<float>::operator<<(&main,(result *)psVar34);
    data<float>::operator<<(&main,2.2984);
    data<float>::operator<<(&main,0.688);
    data<float>::operator<<(&main,1.35908);
    data<float>::operator<<(&main,0.42896);
    data<float>::operator<<(&main,0.9817);
    data<float>::operator<<(&main,(end *)psVar34);
    data<float>::operator<<(&main,1.0);
    data<float>::operator<<(&main,0.4);
    data<float>::operator<<(&main,1.25);
    data<float>::operator<<(&main,-0.1);
    data<float>::operator<<(&main,0.7);
    data<float>::operator<<(&main,(end *)psVar34);
    data<float>::operator<<(&main,2.2);
    data<float>::operator<<(&main,0.2);
    data<float>::operator<<(&main,-0.1);
    data<float>::operator<<(&main,0.0);
    data<float>::operator<<(&main,0.24);
    data<float>::operator<<(&main,(end *)psVar34);
    data<float>::operator<<(&main,2.3);
    data<float>::operator<<(&main,0.9);
    data<float>::operator<<(&main,0.56);
    data<float>::operator<<(&main,2.26);
    data<float>::operator<<(&main,0.9);
    data<float>::operator<<(&main,(end *)psVar34);
    data<float>::operator<<(&main,5.0);
    data<float>::operator<<(&main,1.0);
    data<float>::operator<<(&main,0.5);
    data<float>::operator<<(&main,0.6);
    data<float>::operator<<(&main,0.2);
    data<float>::operator<<(&main,(end *)psVar34);
    data<float>::operator<<(&main,11.0);
    data<float>::operator<<(&main,0.4);
    data<float>::operator<<(&main,1.25);
    data<float>::operator<<(&main,-0.1);
    data<float>::operator<<(&main,0.7);
    data<float>::operator<<(&main,(end *)psVar34);
    data<float>::operator<<(&main,12.2);
    data<float>::operator<<(&main,0.2);
    data<float>::operator<<(&main,-0.1);
    data<float>::operator<<(&main,0.0);
    data<float>::operator<<(&main,0.24);
    data<float>::operator<<(&main,(end *)psVar34);
    data<float>::operator<<(&main,12.3);
    data<float>::operator<<(&main,0.9);
    data<float>::operator<<(&main,0.56);
    data<float>::operator<<(&main,2.26);
    data<float>::operator<<(&main,0.9);
    data<float>::operator<<(&main,(end *)psVar34);
    data<float>::operator<<(&main,15.0);
    data<float>::operator<<(&main,1.0);
    data<float>::operator<<(&main,0.5);
    data<float>::operator<<(&main,0.6);
    data<float>::operator<<(&main,0.2);
    data<float>::operator<<(&main,(end *)psVar34);
    data<float>::operator<<(&main,(result *)psVar34);
    data<float>::operator<<(&main,2.62319);
    data<float>::operator<<(&main,0.7005);
    data<float>::operator<<(&main,1.38387);
    data<float>::operator<<(&main,0.43678);
    data<float>::operator<<(&main,0.99967);
    data<float>::operator<<(&main,(end *)psVar34);
    data<float>::operator<<(&main,27.0);
    data<float>::operator<<(&main,1.0);
    data<float>::operator<<(&main,-1.0);
    data<float>::operator<<(&main,42.0);
    data<float>::operator<<(&main,14.0);
    data<float>::operator<<(&main,(end *)psVar34);
    data<float>::operator<<(&main,(result *)psVar34);
    data<float>::operator<<(&main,27.0);
    data<float>::operator<<(&main,1.0);
    data<float>::operator<<(&main,-1.0);
    data<float>::operator<<(&main,42.0);
    data<float>::operator<<(&main,14.0);
    data<float>::operator<<(&main,(end *)psVar34);
    data<float>::operator<<(&main,1.0);
    data<float>::operator<<(&main,0.4);
    data<float>::operator<<(&main,1.25);
    data<float>::operator<<(&main,-0.1);
    data<float>::operator<<(&main,0.7);
    data<float>::operator<<(&main,(end *)psVar34);
    data<float>::operator<<(&main,2.2);
    data<float>::operator<<(&main,0.2);
    data<float>::operator<<(&main,-0.1);
    data<float>::operator<<(&main,0.0);
    data<float>::operator<<(&main,0.24);
    data<float>::operator<<(&main,(end *)psVar34);
    data<float>::operator<<(&main,2.3);
    data<float>::operator<<(&main,0.9);
    data<float>::operator<<(&main,0.56);
    data<float>::operator<<(&main,2.26);
    data<float>::operator<<(&main,0.9);
    data<float>::operator<<(&main,(end *)psVar34);
    data<float>::operator<<(&main,5.0);
    data<float>::operator<<(&main,1.0);
    data<float>::operator<<(&main,0.5);
    data<float>::operator<<(&main,0.6);
    data<float>::operator<<(&main,0.2);
    data<float>::operator<<(&main,(end *)psVar34);
    data<float>::operator<<(&main,(result *)psVar34);
    data<float>::operator<<(&main,2.2984);
    data<float>::operator<<(&main,0.688);
    data<float>::operator<<(&main,1.35908);
    data<float>::operator<<(&main,0.42896);
    data<float>::operator<<(&main,0.9817);
    data<float>::operator<<(&main,(end *)psVar34);
    data<float>::operator<<(&main,1.0);
    data<float>::operator<<(&main,0.4);
    data<float>::operator<<(&main,1.25);
    data<float>::operator<<(&main,-0.1);
    data<float>::operator<<(&main,0.7);
    data<float>::operator<<(&main,(end *)psVar34);
    data<float>::operator<<(&main,2.2);
    data<float>::operator<<(&main,0.2);
    data<float>::operator<<(&main,-0.1);
    data<float>::operator<<(&main,0.0);
    data<float>::operator<<(&main,0.24);
    data<float>::operator<<(&main,(end *)psVar34);
    data<float>::operator<<(&main,2.3);
    data<float>::operator<<(&main,0.9);
    data<float>::operator<<(&main,0.56);
    data<float>::operator<<(&main,2.26);
    data<float>::operator<<(&main,0.9);
    data<float>::operator<<(&main,(end *)psVar34);
    data<float>::operator<<(&main,5.0);
    data<float>::operator<<(&main,1.0);
    data<float>::operator<<(&main,0.5);
    data<float>::operator<<(&main,0.6);
    data<float>::operator<<(&main,0.2);
    data<float>::operator<<(&main,(end *)psVar34);
    data<float>::operator<<(&main,11.0);
    data<float>::operator<<(&main,0.4);
    data<float>::operator<<(&main,1.25);
    data<float>::operator<<(&main,-0.1);
    data<float>::operator<<(&main,0.7);
    data<float>::operator<<(&main,(end *)psVar34);
    data<float>::operator<<(&main,12.2);
    data<float>::operator<<(&main,0.2);
    data<float>::operator<<(&main,-0.1);
    data<float>::operator<<(&main,0.0);
    data<float>::operator<<(&main,0.24);
    data<float>::operator<<(&main,(end *)psVar34);
    data<float>::operator<<(&main,12.3);
    data<float>::operator<<(&main,0.9);
    data<float>::operator<<(&main,0.56);
    data<float>::operator<<(&main,2.26);
    data<float>::operator<<(&main,0.9);
    data<float>::operator<<(&main,(end *)psVar34);
    data<float>::operator<<(&main,15.0);
    data<float>::operator<<(&main,1.0);
    data<float>::operator<<(&main,0.5);
    data<float>::operator<<(&main,0.6);
    data<float>::operator<<(&main,0.2);
    data<float>::operator<<(&main,(end *)psVar34);
    data<float>::operator<<(&main,(result *)psVar34);
    data<float>::operator<<(&main,2.62319);
    data<float>::operator<<(&main,0.7005);
    data<float>::operator<<(&main,1.38387);
    data<float>::operator<<(&main,0.43678);
    data<float>::operator<<(&main,0.99967);
    data<float>::operator<<(&main,(end *)psVar34);
    data<float>::operator<<(&main,27.0);
    data<float>::operator<<(&main,1.0);
    data<float>::operator<<(&main,-1.0);
    data<float>::operator<<(&main,42.0);
    data<float>::operator<<(&main,14.0);
    data<float>::operator<<(&main,(end *)psVar34);
    data<float>::operator<<(&main,(result *)psVar34);
    data<float>::operator<<(&main,27.0);
    data<float>::operator<<(&main,1.0);
    data<float>::operator<<(&main,-1.0);
    data<float>::operator<<(&main,42.0);
    data<float>::operator<<(&main,14.0);
    data<float>::operator<<(&main,(end *)psVar34);
    data<float>::operator<<(&main,1.0);
    data<float>::operator<<(&main,0.4);
    data<float>::operator<<(&main,1.25);
    data<float>::operator<<(&main,-0.1);
    data<float>::operator<<(&main,0.7);
    data<float>::operator<<(&main,(end *)psVar34);
    data<float>::operator<<(&main,2.2);
    data<float>::operator<<(&main,0.2);
    data<float>::operator<<(&main,-0.1);
    data<float>::operator<<(&main,0.0);
    data<float>::operator<<(&main,0.24);
    data<float>::operator<<(&main,(end *)psVar34);
    data<float>::operator<<(&main,2.3);
    data<float>::operator<<(&main,0.9);
    data<float>::operator<<(&main,0.56);
    data<float>::operator<<(&main,2.26);
    data<float>::operator<<(&main,0.9);
    data<float>::operator<<(&main,(end *)psVar34);
    data<float>::operator<<(&main,5.0);
    data<float>::operator<<(&main,1.0);
    data<float>::operator<<(&main,0.5);
    data<float>::operator<<(&main,0.6);
    data<float>::operator<<(&main,0.2);
    data<float>::operator<<(&main,(end *)psVar34);
    data<float>::operator<<(&main,(result *)psVar34);
    data<float>::operator<<(&main,2.2984);
    data<float>::operator<<(&main,0.688);
    data<float>::operator<<(&main,1.35908);
    data<float>::operator<<(&main,0.42896);
    data<float>::operator<<(&main,0.9817);
    data<float>::operator<<(&main,(end *)psVar34);
    data<float>::operator<<(&main,1.0);
    data<float>::operator<<(&main,0.4);
    data<float>::operator<<(&main,1.25);
    data<float>::operator<<(&main,-0.1);
    data<float>::operator<<(&main,0.7);
    data<float>::operator<<(&main,(end *)psVar34);
    data<float>::operator<<(&main,2.2);
    data<float>::operator<<(&main,0.2);
    data<float>::operator<<(&main,-0.1);
    data<float>::operator<<(&main,0.0);
    data<float>::operator<<(&main,0.24);
    data<float>::operator<<(&main,(end *)psVar34);
    data<float>::operator<<(&main,2.3);
    data<float>::operator<<(&main,0.9);
    data<float>::operator<<(&main,0.56);
    data<float>::operator<<(&main,2.26);
    data<float>::operator<<(&main,0.9);
    data<float>::operator<<(&main,(end *)psVar34);
    data<float>::operator<<(&main,5.0);
    data<float>::operator<<(&main,1.0);
    data<float>::operator<<(&main,0.5);
    data<float>::operator<<(&main,0.6);
    data<float>::operator<<(&main,0.2);
    data<float>::operator<<(&main,(end *)psVar34);
    data<float>::operator<<(&main,11.0);
    data<float>::operator<<(&main,0.4);
    data<float>::operator<<(&main,1.25);
    data<float>::operator<<(&main,-0.1);
    data<float>::operator<<(&main,0.7);
    data<float>::operator<<(&main,(end *)psVar34);
    data<float>::operator<<(&main,12.2);
    data<float>::operator<<(&main,0.2);
    data<float>::operator<<(&main,-0.1);
    data<float>::operator<<(&main,0.0);
    data<float>::operator<<(&main,0.24);
    data<float>::operator<<(&main,(end *)psVar34);
    data<float>::operator<<(&main,12.3);
    data<float>::operator<<(&main,0.9);
    data<float>::operator<<(&main,0.56);
    data<float>::operator<<(&main,2.26);
    data<float>::operator<<(&main,0.9);
    data<float>::operator<<(&main,(end *)psVar34);
    data<float>::operator<<(&main,15.0);
    data<float>::operator<<(&main,1.0);
    data<float>::operator<<(&main,0.5);
    data<float>::operator<<(&main,0.6);
    data<float>::operator<<(&main,0.2);
    data<float>::operator<<(&main,(end *)psVar34);
    data<float>::operator<<(&main,(result *)psVar34);
    data<float>::operator<<(&main,2.62319);
    data<float>::operator<<(&main,0.7005);
    data<float>::operator<<(&main,1.38387);
    data<float>::operator<<(&main,0.43678);
    data<float>::operator<<(&main,0.99967);
    data<float>::operator<<(&main,(end *)psVar34);
    data<float>::operator<<(&main,27.0);
    data<float>::operator<<(&main,1.0);
    data<float>::operator<<(&main,-1.0);
    data<float>::operator<<(&main,42.0);
    data<float>::operator<<(&main,14.0);
    data<float>::operator<<(&main,(end *)psVar34);
    data<float>::operator<<(&main,(result *)psVar34);
    data<float>::operator<<(&main,27.0);
    data<float>::operator<<(&main,1.0);
    data<float>::operator<<(&main,-1.0);
    data<float>::operator<<(&main,42.0);
    data<float>::operator<<(&main,14.0);
    data<float>::operator<<(&main,(end *)psVar34);
  }
  _Var11._M_p = fn._M_dataplus._M_p;
  __n_00 = (ulong)(uint)pattern_number;
  std::vector<Imf_3_2::Header,_std::allocator<Imf_3_2::Header>_>::vector
            (&headers,__n_00,(allocator_type *)&s);
  lVar18 = Imf_3_2::Header::displayWindow();
  *(undefined4 *)(lVar18 + 8) = 0xa4;
  lVar18 = Imf_3_2::Header::displayWindow();
  *(undefined4 *)(lVar18 + 0xc) = 0xd8;
  iVar12 = random_int(400);
  piVar19 = (int *)Imf_3_2::Header::dataWindow();
  *piVar19 = iVar12 + -200;
  piVar19 = (int *)Imf_3_2::Header::dataWindow();
  iVar12 = *piVar19;
  iVar13 = random_int(400);
  lVar18 = Imf_3_2::Header::dataWindow();
  *(int *)(lVar18 + 8) = iVar12 + iVar13 + 0x28;
  iVar12 = random_int(400);
  lVar18 = Imf_3_2::Header::dataWindow();
  *(int *)(lVar18 + 4) = iVar12 + -200;
  lVar18 = Imf_3_2::Header::dataWindow();
  iVar12 = *(int *)(lVar18 + 4);
  iVar13 = random_int(400);
  lVar18 = Imf_3_2::Header::dataWindow();
  *(int *)(lVar18 + 0xc) = iVar12 + iVar13 + 0x28;
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"data window: ",0xd);
  piVar19 = (int *)Imf_3_2::Header::dataWindow();
  poVar20 = (ostream *)std::ostream::operator<<(&std::cout,*piVar19);
  s = (ostringstream)0x2c;
  poVar20 = std::__ostream_insert<char,std::char_traits<char>>(poVar20,(char *)&s,1);
  lVar18 = Imf_3_2::Header::dataWindow();
  poVar20 = (ostream *)std::ostream::operator<<(poVar20,*(int *)(lVar18 + 4));
  s = (ostringstream)0x20;
  poVar20 = std::__ostream_insert<char,std::char_traits<char>>(poVar20,(char *)&s,1);
  lVar18 = Imf_3_2::Header::dataWindow();
  poVar20 = (ostream *)std::ostream::operator<<(poVar20,*(int *)(lVar18 + 8));
  s = (ostringstream)0x2c;
  poVar20 = std::__ostream_insert<char,std::char_traits<char>>(poVar20,(char *)&s,1);
  lVar18 = Imf_3_2::Header::dataWindow();
  plVar21 = (long *)std::ostream::operator<<(poVar20,*(int *)(lVar18 + 0xc));
  std::ios::widen((char)*(undefined8 *)(*plVar21 + -0x18) + (char)plVar21);
  std::ostream::put((char)plVar21);
  std::ostream::flush();
  Imf_3_2::Header::setType
            ((string *)
             headers.super__Vector_base<Imf_3_2::Header,_std::allocator<Imf_3_2::Header>_>._M_impl.
             super__Vector_impl_data._M_start);
  puVar22 = (undefined4 *)Imf_3_2::Header::compression();
  *puVar22 = 2;
  local_198._M_allocated_capacity._0_6_ = 0x3074726150;
  local_1a0 = (_Base_ptr)0x5;
  _s = (pointer)&local_198;
  Imf_3_2::Header::setName
            ((string *)
             headers.super__Vector_base<Imf_3_2::Header,_std::allocator<Imf_3_2::Header>_>._M_impl.
             super__Vector_impl_data._M_start);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)_s != &local_198) {
    operator_delete(_s,local_198._M_allocated_capacity + 1);
  }
  if (1 < pattern_number) {
    uVar39 = 1;
    lVar18 = 0x38;
    do {
      Imf_3_2::Header::operator=
                (headers.super__Vector_base<Imf_3_2::Header,_std::allocator<Imf_3_2::Header>_>.
                 _M_impl.super__Vector_impl_data._M_start + lVar18,
                 headers.super__Vector_base<Imf_3_2::Header,_std::allocator<Imf_3_2::Header>_>.
                 _M_impl.super__Vector_impl_data._M_start);
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&s);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&s,"Part",4);
      std::ostream::operator<<((ostringstream *)&s,(int)uVar39);
      pHVar10 = headers.super__Vector_base<Imf_3_2::Header,_std::allocator<Imf_3_2::Header>_>.
                _M_impl.super__Vector_impl_data._M_start;
      std::__cxx11::stringbuf::str();
      Imf_3_2::Header::setName((string *)(pHVar10 + lVar18));
      if ((pointer *)
          data.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
          _M_start !=
          &data.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
           _M_end_of_storage) {
        operator_delete(data.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        (long)data.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                              super__Vector_impl_data._M_end_of_storage + 1);
      }
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)&s);
      std::ios_base::~ios_base(local_138);
      uVar39 = uVar39 + 1;
      lVar18 = lVar18 + 0x38;
    } while (__n_00 != uVar39);
  }
  local_220 = (data<float> *)operator_new(__n_00 * 0xa0);
  local_1e8.
  super__Vector_base<(anonymous_namespace)::data<float>,_std::allocator<(anonymous_namespace)::data<float>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = local_220 + __n_00;
  local_1e8.
  super__Vector_base<(anonymous_namespace)::data<float>,_std::allocator<(anonymous_namespace)::data<float>_>_>
  ._M_impl.super__Vector_impl_data._M_start = local_220;
  local_1e8.
  super__Vector_base<(anonymous_namespace)::data<float>,_std::allocator<(anonymous_namespace)::data<float>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = local_220;
  if (pattern_number != 0) {
    uVar39 = 0;
    do {
      uVar30 = uVar39;
      puVar1 = (undefined8 *)
               ((long)&(local_220->_results).
                       super__Vector_base<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish + uVar30 + 2);
      *puVar1 = 0;
      puVar1[1] = 0;
      puVar1 = (undefined8 *)
               ((long)&(local_220->_results).
                       super__Vector_base<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start + uVar30);
      *puVar1 = 0;
      puVar1[1] = 0;
      puVar1 = (undefined8 *)
               ((long)&(local_220->_current_result).
                       super__Vector_base<float,_std::allocator<float>_>._M_impl.
                       super__Vector_impl_data._M_finish + uVar30);
      *puVar1 = 0;
      puVar1[1] = 0;
      puVar1 = (undefined8 *)
               ((long)&(local_220->_channels).
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage + uVar30);
      *puVar1 = 0;
      puVar1[1] = 0;
      puVar1 = (undefined8 *)
               ((long)&(local_220->_channels).
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start + uVar30);
      *puVar1 = 0;
      puVar1[1] = 0;
      puVar1 = (undefined8 *)
               ((long)&(local_220->_current_sample).
                       super__Vector_base<float,_std::allocator<float>_>._M_impl.
                       super__Vector_impl_data._M_start + uVar30);
      *puVar1 = 0;
      puVar1[1] = 0;
      puVar1 = (undefined8 *)
               ((long)&(local_220->_current_sample).
                       super__Vector_base<float,_std::allocator<float>_>._M_impl.
                       super__Vector_impl_data._M_end_of_storage + uVar30);
      *puVar1 = 0;
      puVar1[1] = 0;
      puVar1 = (undefined8 *)
               ((long)&(local_220->_current_pixel).
                       super__Vector_base<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish + uVar30);
      *puVar1 = 0;
      puVar1[1] = 0;
      puVar1 = (undefined8 *)
               ((long)&(local_220->_samples).
                       super__Vector_base<std::vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>,_std::allocator<std::vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start + uVar30);
      *puVar1 = 0;
      puVar1[1] = 0;
      *(undefined8 *)
       ((long)&(local_220->_samples).
               super__Vector_base<std::vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>,_std::allocator<std::vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>_>_>
               ._M_impl.super__Vector_impl_data._M_end_of_storage + uVar30) = 0;
      sVar16 = std::type_info::hash_code((type_info *)&float::typeinfo);
      sVar17 = std::type_info::hash_code((type_info *)&Imath_3_2::half::typeinfo);
      *(uint *)((long)&local_220->_type + uVar30) = (sVar16 != sVar17) + 1;
      uVar39 = uVar30 + 0xa0;
    } while (__n_00 * 0xa0 != uVar30 + 0xa0);
    local_1e8.
    super__Vector_base<(anonymous_namespace)::data<float>,_std::allocator<(anonymous_namespace)::data<float>_>_>
    ._M_impl.super__Vector_impl_data._M_finish =
         (pointer)((long)&local_220[1]._channels.
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start + uVar30);
    if (1 < pattern_number) {
      lVar18 = 0x80;
      uVar39 = 0;
      do {
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::operator=((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)((long)local_220 + lVar18 + -0x80),&main._channels);
        local_220 = local_1e8.
                    super__Vector_base<(anonymous_namespace)::data<float>,_std::allocator<(anonymous_namespace)::data<float>_>_>
                    ._M_impl.super__Vector_impl_data._M_start;
        std::
        vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
        ::operator=((vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
                     *)((long)local_1e8.
                              super__Vector_base<(anonymous_namespace)::data<float>,_std::allocator<(anonymous_namespace)::data<float>_>_>
                              ._M_impl.super__Vector_impl_data._M_start + lVar18 + -0x50),
                    &main._results);
        *(PixelType *)
         ((long)&(local_220->_current_result).super__Vector_base<float,_std::allocator<float>_>.
                 _M_impl.super__Vector_impl_data._M_start + lVar18) = main._type;
        std::
        vector<std::vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>,_std::allocator<std::vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>_>_>
        ::resize((vector<std::vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>,_std::allocator<std::vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>_>_>
                  *)((long)&(local_220->_channels).
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start + lVar18),
                 ((long)main._samples.
                        super__Vector_base<std::vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>,_std::allocator<std::vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_finish -
                  (long)main._samples.
                        super__Vector_base<std::vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>,_std::allocator<std::vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start >> 3) * -0x5555555555555555);
        uVar39 = uVar39 + 1;
        uVar30 = ((long)local_1e8.
                        super__Vector_base<(anonymous_namespace)::data<float>,_std::allocator<(anonymous_namespace)::data<float>_>_>
                        ._M_impl.super__Vector_impl_data._M_finish - (long)local_220 >> 5) *
                 -0x3333333333333333;
        lVar18 = lVar18 + 0xa0;
      } while (uVar39 < uVar30);
      if (main._samples.
          super__Vector_base<std::vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>,_std::allocator<std::vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish !=
          main._samples.
          super__Vector_base<std::vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>,_std::allocator<std::vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start) {
        uVar39 = 0;
        pvVar23 = main._samples.
                  super__Vector_base<std::vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>,_std::allocator<std::vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        pvVar26 = main._samples.
                  super__Vector_base<std::vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>,_std::allocator<std::vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish;
        do {
          if (pvVar23[uVar39].
              super__Vector_base<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish !=
              pvVar23[uVar39].
              super__Vector_base<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start) {
            lVar18 = 0;
            uVar36 = 0;
            do {
              iVar12 = random_int((int)uVar30);
              std::
              vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
              ::push_back(local_220[iVar12]._samples.
                          super__Vector_base<std::vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>,_std::allocator<std::vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start + uVar39,
                          (value_type *)
                          ((long)&((main._samples.
                                    super__Vector_base<std::vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>,_std::allocator<std::vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>_>_>
                                    ._M_impl.super__Vector_impl_data._M_start[uVar39].
                                    super__Vector_base<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
                                    ._M_impl.super__Vector_impl_data._M_start)->
                                  super__Vector_base<float,_std::allocator<float>_>)._M_impl.
                                  super__Vector_impl_data + lVar18));
              uVar36 = uVar36 + 1;
              lVar18 = lVar18 + 0x18;
              pvVar23 = main._samples.
                        super__Vector_base<std::vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>,_std::allocator<std::vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start;
              pvVar26 = main._samples.
                        super__Vector_base<std::vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>,_std::allocator<std::vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_finish;
            } while (uVar36 < (ulong)(((long)main._samples.
                                             super__Vector_base<std::vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>,_std::allocator<std::vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>_>_>
                                             ._M_impl.super__Vector_impl_data._M_start[uVar39].
                                             super__Vector_base<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
                                             ._M_impl.super__Vector_impl_data._M_finish -
                                       (long)main._samples.
                                             super__Vector_base<std::vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>,_std::allocator<std::vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>_>_>
                                             ._M_impl.super__Vector_impl_data._M_start[uVar39].
                                             super__Vector_base<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
                                             ._M_impl.super__Vector_impl_data._M_start >> 3) *
                                     -0x5555555555555555));
          }
          uVar39 = uVar39 + 1;
        } while (uVar39 < (ulong)(((long)pvVar26 - (long)pvVar23 >> 3) * -0x5555555555555555));
      }
    }
    if (pattern_number == 1) {
      bVar9 = true;
      data<float>::setHeader
                (&main,headers.super__Vector_base<Imf_3_2::Header,_std::allocator<Imf_3_2::Header>_>
                       ._M_impl.super__Vector_impl_data._M_start);
      goto LAB_00133f6c;
    }
    if (0 < pattern_number) {
      lVar18 = 0;
      pdVar29 = local_220;
      do {
        data<float>::setHeader
                  (pdVar29,headers.
                           super__Vector_base<Imf_3_2::Header,_std::allocator<Imf_3_2::Header>_>.
                           _M_impl.super__Vector_impl_data._M_start + lVar18);
        lVar18 = lVar18 + 0x38;
        pdVar29 = pdVar29 + 1;
      } while (__n_00 * 0x38 - lVar18 != 0);
    }
  }
  bVar9 = false;
LAB_00133f6c:
  iVar12 = Imf_3_2::globalThreadCount();
  Imf_3_2::MultiPartOutputFile::MultiPartOutputFile
            (&f,_Var11._M_p,
             headers.super__Vector_base<Imf_3_2::Header,_std::allocator<Imf_3_2::Header>_>._M_impl.
             super__Vector_impl_data._M_start,
             (int)((ulong)((long)headers.
                                 super__Vector_base<Imf_3_2::Header,_std::allocator<Imf_3_2::Header>_>
                                 ._M_impl.super__Vector_impl_data._M_finish -
                          (long)headers.
                                super__Vector_base<Imf_3_2::Header,_std::allocator<Imf_3_2::Header>_>
                                ._M_impl.super__Vector_impl_data._M_start) >> 3) * -0x49249249,false
             ,iVar12);
  if (0 < pattern_number) {
    uVar39 = 0;
    do {
      Imf_3_2::DeepScanLineOutputPart::DeepScanLineOutputPart
                ((DeepScanLineOutputPart *)local_1c0,&f,(int)uVar39);
      pdVar29 = local_220 + uVar39;
      pdVar27 = pdVar29;
      if (bVar9) {
        pdVar27 = &main;
      }
      Imf_3_2::DeepScanLineOutputPart::header();
      piVar19 = (int *)Imf_3_2::Header::dataWindow();
      iVar13 = *piVar19;
      iVar5 = piVar19[1];
      iVar15 = piVar19[2];
      iVar6 = piVar19[3];
      iVar12 = (iVar15 - iVar13) + 1;
      if (iVar6 < iVar5 || iVar15 < iVar13) {
        iVar12 = 1;
      }
      iVar14 = (iVar6 - iVar5) + 1;
      if (iVar6 < iVar5 || iVar15 < iVar13) {
        iVar14 = 1;
      }
      __n = (size_type)(iVar12 * iVar14);
      pdVar37 = pdVar29;
      if (bVar9) {
        pdVar37 = &main;
      }
      pvVar23 = (pdVar37->_samples).
                super__Vector_base<std::vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>,_std::allocator<std::vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      local_1d0 = __n / (ulong)(((long)(pdVar37->_results).
                                       super__Vector_base<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
                                       ._M_impl.super__Vector_impl_data._M_finish -
                                 (long)(pdVar37->_results).
                                       super__Vector_base<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
                                       ._M_impl.super__Vector_impl_data._M_start >> 3) *
                               -0x5555555555555555);
      lVar40 = 0;
      lVar18 = (long)(pdVar37->_samples).
                     super__Vector_base<std::vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>,_std::allocator<std::vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish - (long)pvVar23;
      if (lVar18 != 0) {
        lVar18 = (lVar18 >> 3) * -0x5555555555555555;
        lVar18 = lVar18 + (ulong)(lVar18 == 0);
        ppvVar28 = (pointer *)
                   ((long)&(pvVar23->
                           super__Vector_base<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
                           )._M_impl.super__Vector_impl_data + 8);
        lVar40 = 0;
        do {
          lVar40 = lVar40 + ((long)*ppvVar28 -
                             (long)((_Vector_impl_data *)(ppvVar28 + -1))->_M_start >> 3) *
                            -0x5555555555555555;
          ppvVar28 = ppvVar28 + 3;
          lVar18 = lVar18 + -1;
        } while (lVar18 != 0);
      }
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
                (&counts,__n,(allocator_type *)&s);
      local_1c8 = uVar39;
      pdVar38 = pdVar29;
      if (bVar9) {
        pdVar38 = &main;
      }
      std::
      vector<std::vector<float_*,_std::allocator<float_*>_>,_std::allocator<std::vector<float_*,_std::allocator<float_*>_>_>_>
      ::vector(&sample_pointers,
               (long)(pdVar38->_channels).
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish -
               (long)(pdVar27->_channels).
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start >> 5,(allocator_type *)&s);
      std::
      vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
      ::vector(&sample_buffers,
               (long)(pdVar38->_channels).
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish -
               (long)(pdVar27->_channels).
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start >> 5,(allocator_type *)&s);
      if (sample_buffers.
          super__Vector_base<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish !=
          sample_buffers.
          super__Vector_base<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start) {
        lVar18 = local_1d0 + 1;
        lVar31 = 0;
        uVar39 = 0;
        do {
          std::vector<float_*,_std::allocator<float_*>_>::resize
                    ((vector<float_*,_std::allocator<float_*>_> *)
                     ((long)&((sample_pointers.
                               super__Vector_base<std::vector<float_*,_std::allocator<float_*>_>,_std::allocator<std::vector<float_*,_std::allocator<float_*>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_start)->
                             super__Vector_base<float_*,_std::allocator<float_*>_>)._M_impl.
                             super__Vector_impl_data._M_start + lVar31),__n);
          std::vector<float,_std::allocator<float>_>::resize
                    ((vector<float,_std::allocator<float>_> *)
                     ((long)&((sample_buffers.
                               super__Vector_base<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_start)->
                             super__Vector_base<float,_std::allocator<float>_>)._M_impl.
                             super__Vector_impl_data._M_start + lVar31),lVar40 * lVar18);
          uVar39 = uVar39 + 1;
          lVar31 = lVar31 + 0x18;
        } while (uVar39 < (ulong)(((long)sample_buffers.
                                         super__Vector_base<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
                                         ._M_impl.super__Vector_impl_data._M_finish -
                                   (long)sample_buffers.
                                         super__Vector_base<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
                                         ._M_impl.super__Vector_impl_data._M_start >> 3) *
                                 -0x5555555555555555));
      }
      if (iVar12 * iVar14 != 0) {
        pvVar23 = (pdVar37->_samples).
                  super__Vector_base<std::vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>,_std::allocator<std::vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        sVar24 = 0;
        lVar40 = 0;
        lVar18 = 0;
        do {
          pvVar7 = *(pointer *)
                    ((long)&pvVar23[lVar18].
                            super__Vector_base<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
                            ._M_impl.super__Vector_impl_data + 8);
          pvVar8 = pvVar23[lVar18].
                   super__Vector_base<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          lVar31 = ((long)pvVar7 - (long)pvVar8 >> 3) * -0x5555555555555555;
          counts.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_start[sVar24] = (uint)lVar31;
          if (pvVar7 != pvVar8) {
            if ((pdVar38->_channels).
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish !=
                (pdVar27->_channels).
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start) {
              uVar39 = 0;
              do {
                plVar21 = *(long **)&(pdVar37->_samples).
                                     super__Vector_base<std::vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>,_std::allocator<std::vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>_>_>
                                     ._M_impl.super__Vector_impl_data._M_start[lVar18].
                                     super__Vector_base<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
                                     ._M_impl.super__Vector_impl_data;
                pfVar35 = sample_buffers.
                          super__Vector_base<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start[uVar39].
                          super__Vector_base<float,_std::allocator<float>_>._M_impl.
                          super__Vector_impl_data._M_start + lVar40;
                lVar32 = 0;
                do {
                  pfVar35[lVar32] = *(float *)(*plVar21 + uVar39 * 4);
                  lVar32 = lVar32 + 1;
                  plVar21 = plVar21 + 3;
                } while (lVar31 + (ulong)(lVar31 == 0) != lVar32);
                sample_pointers.
                super__Vector_base<std::vector<float_*,_std::allocator<float_*>_>,_std::allocator<std::vector<float_*,_std::allocator<float_*>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start[uVar39].
                super__Vector_base<float_*,_std::allocator<float_*>_>._M_impl.
                super__Vector_impl_data._M_start[sVar24] = pfVar35;
                uVar39 = uVar39 + 1;
              } while (uVar39 < (ulong)((long)(pdVar38->_channels).
                                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                              ._M_impl.super__Vector_impl_data._M_finish -
                                        (long)(pdVar27->_channels).
                                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                              ._M_impl.super__Vector_impl_data._M_start >> 5));
              pvVar23 = (pdVar37->_samples).
                        super__Vector_base<std::vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>,_std::allocator<std::vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start;
            }
            lVar40 = lVar40 + lVar31;
          }
          lVar18 = lVar18 + 1;
          if (lVar18 == ((long)(pdVar37->_samples).
                               super__Vector_base<std::vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>,_std::allocator<std::vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_finish - (long)pvVar23 >> 3) *
                        -0x5555555555555555) {
            lVar18 = 0;
          }
          sVar24 = sVar24 + 1;
        } while (sVar24 != __n);
      }
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout," wrote ",7);
      poVar20 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
      std::__ostream_insert<char,std::char_traits<char>>(poVar20," samples  into ",0xf);
      poVar20 = std::ostream::_M_insert<unsigned_long>((ulong)poVar20);
      std::__ostream_insert<char,std::char_traits<char>>(poVar20," pixels\n",8);
      local_1a0 = (_Base_ptr)((ulong)local_1a0 & 0xffffffff00000000);
      local_198._M_allocated_capacity = 0;
      local_198._8_8_ = &local_1a0;
      local_180 = 0;
      local_188 = (_Base_ptr *)local_198._8_8_;
      Imf_3_2::Slice::Slice(local_178,HALF,(char *)0x0,0,0,1,1,0.0,false,false);
      Imf_3_2::Slice::Slice
                ((Slice *)&data,UINT,
                 (char *)(counts.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_start +
                         (-(long)iVar13 - (long)(iVar5 * iVar12))),4,(long)iVar12 * 4,1,1,0.0,false,
                 false);
      Imf_3_2::DeepFrameBuffer::insertSampleCountSlice((Slice *)&s);
      pbVar33 = (pdVar27->_channels).
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      if ((pdVar38->_channels).
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish != pbVar33) {
        if (bVar9) {
          pdVar29 = &main;
        }
        lVar18 = 0;
        lVar40 = 0;
        uVar39 = 0;
        do {
          Imf_3_2::DeepSlice::DeepSlice
                    ((DeepSlice *)&data,pdVar29->_type,
                     (char *)(*(long *)((long)&((sample_pointers.
                                                 super__Vector_base<std::vector<float_*,_std::allocator<float_*>_>,_std::allocator<std::vector<float_*,_std::allocator<float_*>_>_>_>
                                                 ._M_impl.super__Vector_impl_data._M_start)->
                                               super__Vector_base<float_*,_std::allocator<float_*>_>
                                               )._M_impl.super__Vector_impl_data._M_start + lVar18)
                              + (long)iVar13 * -8 + (long)(iVar5 * iVar12) * -8),8,(long)iVar12 << 3
                     ,4,1,1,0.0,false,false);
          Imf_3_2::DeepFrameBuffer::insert
                    ((string *)&s,(DeepSlice *)((long)&(pbVar33->_M_dataplus)._M_p + lVar40));
          uVar39 = uVar39 + 1;
          pbVar33 = (pdVar27->_channels).
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          lVar40 = lVar40 + 0x20;
          lVar18 = lVar18 + 0x18;
        } while (uVar39 < (ulong)((long)(pdVar38->_channels).
                                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                        ._M_impl.super__Vector_impl_data._M_finish - (long)pbVar33
                                 >> 5));
      }
      Imf_3_2::DeepScanLineOutputPart::setFrameBuffer((DeepFrameBuffer *)local_1c0);
      Imf_3_2::DeepScanLineOutputPart::writePixels((int)(DeepFrameBuffer *)local_1c0);
      uVar39 = local_1c8;
      std::
      _Rb_tree<Imf_3_2::Name,_std::pair<const_Imf_3_2::Name,_Imf_3_2::DeepSlice>,_std::_Select1st<std::pair<const_Imf_3_2::Name,_Imf_3_2::DeepSlice>_>,_std::less<Imf_3_2::Name>,_std::allocator<std::pair<const_Imf_3_2::Name,_Imf_3_2::DeepSlice>_>_>
      ::~_Rb_tree((_Rb_tree<Imf_3_2::Name,_std::pair<const_Imf_3_2::Name,_Imf_3_2::DeepSlice>,_std::_Select1st<std::pair<const_Imf_3_2::Name,_Imf_3_2::DeepSlice>_>,_std::less<Imf_3_2::Name>,_std::allocator<std::pair<const_Imf_3_2::Name,_Imf_3_2::DeepSlice>_>_>
                   *)&s);
      std::
      vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
      ::~vector(&sample_buffers);
      std::
      vector<std::vector<float_*,_std::allocator<float_*>_>,_std::allocator<std::vector<float_*,_std::allocator<float_*>_>_>_>
      ::~vector(&sample_pointers);
      if (counts.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(counts.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                        _M_impl.super__Vector_impl_data._M_start,
                        CONCAT62(counts.
                                 super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                 _M_impl.super__Vector_impl_data._M_end_of_storage._2_6_,
                                 counts.
                                 super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                 _M_impl.super__Vector_impl_data._M_end_of_storage._0_2_) -
                        (long)counts.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                              ._M_impl.super__Vector_impl_data._M_start);
      }
      uVar39 = uVar39 + 1;
    } while (uVar39 != __n_00);
  }
  Imf_3_2::MultiPartOutputFile::~MultiPartOutputFile(&f);
  std::
  vector<(anonymous_namespace)::data<float>,_std::allocator<(anonymous_namespace)::data<float>_>_>::
  ~vector(&local_1e8);
  std::vector<Imf_3_2::Header,_std::allocator<Imf_3_2::Header>_>::~vector(&headers);
  data.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)0x0;
  data.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data._M_finish =
       (pointer)0x0;
  data.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  Imf_3_2::CompositeDeepScanLine::CompositeDeepScanLine((CompositeDeepScanLine *)&sample_pointers);
  _Var11 = fn._M_dataplus;
  local_1a0 = (_Base_ptr)((ulong)local_1a0 & 0xffffffff00000000);
  local_198._M_allocated_capacity = 0;
  local_198._8_8_ = &local_1a0;
  local_180 = 0;
  local_188 = (_Base_ptr *)local_198._8_8_;
  iVar12 = Imf_3_2::globalThreadCount();
  Imf_3_2::MultiPartInputFile::MultiPartInputFile
            ((MultiPartInputFile *)&sample_buffers,_Var11._M_p,iVar12,true);
  std::vector<Imf_3_2::DeepScanLineInputPart_*,_std::allocator<Imf_3_2::DeepScanLineInputPart_*>_>::
  vector((vector<Imf_3_2::DeepScanLineInputPart_*,_std::allocator<Imf_3_2::DeepScanLineInputPart_*>_>
          *)&counts,__n_00,(allocator_type *)&headers);
  if (0 < pattern_number) {
    uVar39 = 0;
    do {
      this_00 = (DeepScanLineInputPart *)operator_new(8);
      Imf_3_2::DeepScanLineInputPart::DeepScanLineInputPart
                (this_00,(MultiPartInputFile *)&sample_buffers,(int)uVar39);
      *(DeepScanLineInputPart **)
       (counts.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_start + uVar39 * 2) = this_00;
      Imf_3_2::CompositeDeepScanLine::addSource((DeepScanLineInputPart *)&sample_pointers);
      uVar39 = uVar39 + 1;
    } while (__n_00 != uVar39);
  }
  pBVar25 = (Box2i *)Imf_3_2::CompositeDeepScanLine::dataWindow();
  local_214 = SUB41(number_of_parts,0);
  data<float>::setUpFrameBuffer(&main,&data,(FrameBuffer *)&s,pBVar25,local_214);
  Imf_3_2::CompositeDeepScanLine::setFrameBuffer((FrameBuffer *)&sample_pointers);
  if (load_depths) {
    lVar18 = Imf_3_2::CompositeDeepScanLine::dataWindow();
    iVar12 = *(int *)(lVar18 + 4);
    Imf_3_2::CompositeDeepScanLine::dataWindow();
    Imf_3_2::CompositeDeepScanLine::readPixels((int)&sample_pointers,iVar12);
  }
  else {
    lVar18 = Imf_3_2::CompositeDeepScanLine::dataWindow();
    iVar12 = *(int *)(lVar18 + 4);
    while (lVar18 = Imf_3_2::CompositeDeepScanLine::dataWindow(), iVar12 < *(int *)(lVar18 + 0xc)) {
      iVar13 = random_int(0x40);
      lVar18 = Imf_3_2::CompositeDeepScanLine::dataWindow();
      iVar13 = iVar13 + iVar12;
      if (*(int *)(lVar18 + 0xc) < iVar13) {
        lVar18 = Imf_3_2::CompositeDeepScanLine::dataWindow();
        iVar13 = *(int *)(lVar18 + 0xc);
      }
      Imf_3_2::CompositeDeepScanLine::readPixels((int)&sample_pointers,iVar12);
      iVar12 = iVar13;
    }
  }
  pBVar25 = (Box2i *)Imf_3_2::CompositeDeepScanLine::dataWindow();
  data<float>::checkValues(&main,&data,pBVar25,local_214);
  if (0 < pattern_number) {
    uVar39 = 0;
    do {
      operator_delete(*(void **)(counts.
                                 super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                 _M_impl.super__Vector_impl_data._M_start + uVar39 * 2),8);
      uVar39 = uVar39 + 1;
    } while (__n_00 != uVar39);
  }
  if (counts.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(counts.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    CONCAT62(counts.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                             _M_impl.super__Vector_impl_data._M_end_of_storage._2_6_,
                             counts.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                             _M_impl.super__Vector_impl_data._M_end_of_storage._0_2_) -
                    (long)counts.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  Imf_3_2::MultiPartInputFile::~MultiPartInputFile((MultiPartInputFile *)&sample_buffers);
  std::
  _Rb_tree<Imf_3_2::Name,_std::pair<const_Imf_3_2::Name,_Imf_3_2::Slice>,_std::_Select1st<std::pair<const_Imf_3_2::Name,_Imf_3_2::Slice>_>,_std::less<Imf_3_2::Name>,_std::allocator<std::pair<const_Imf_3_2::Name,_Imf_3_2::Slice>_>_>
  ::~_Rb_tree((_Rb_tree<Imf_3_2::Name,_std::pair<const_Imf_3_2::Name,_Imf_3_2::Slice>,_std::_Select1st<std::pair<const_Imf_3_2::Name,_Imf_3_2::Slice>_>,_std::less<Imf_3_2::Name>,_std::allocator<std::pair<const_Imf_3_2::Name,_Imf_3_2::Slice>_>_>
               *)&s);
  Imf_3_2::CompositeDeepScanLine::~CompositeDeepScanLine((CompositeDeepScanLine *)&sample_pointers);
  if (data.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(data.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)data.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)data.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  _Var11._M_p = fn._M_dataplus._M_p;
  if (pattern_number == 1) {
    iVar12 = Imf_3_2::globalThreadCount();
    Imf_3_2::InputFile::InputFile((InputFile *)&counts,_Var11._M_p,iVar12);
    data.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data._M_start
         = (pointer)0x0;
    data.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data._M_finish
         = (pointer)0x0;
    data.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)0x0;
    local_1a0 = (_Base_ptr)((ulong)local_1a0 & 0xffffffff00000000);
    local_198._M_allocated_capacity = 0;
    local_198._8_8_ = &local_1a0;
    local_180 = 0;
    local_188 = (_Base_ptr *)local_198._8_8_;
    Imf_3_2::InputFile::header();
    pBVar25 = (Box2i *)Imf_3_2::Header::dataWindow();
    data<float>::setUpFrameBuffer(&main,&data,(FrameBuffer *)&s,pBVar25,local_214);
    Imf_3_2::InputFile::setFrameBuffer((FrameBuffer *)&counts);
    iVar12 = (pBVar25->min).y;
    if (load_depths) {
      Imf_3_2::InputFile::readPixels((int)&counts,iVar12);
    }
    else {
      while (iVar12 < (pBVar25->max).y) {
        iVar15 = random_int(0x40);
        iVar13 = (pBVar25->max).y;
        iVar5 = iVar15 + iVar12;
        if (iVar13 <= iVar15 + iVar12) {
          iVar5 = iVar13;
        }
        Imf_3_2::InputFile::readPixels((int)&counts,iVar12);
        iVar12 = iVar5;
      }
    }
    data<float>::checkValues(&main,&data,pBVar25,local_214);
    std::
    _Rb_tree<Imf_3_2::Name,_std::pair<const_Imf_3_2::Name,_Imf_3_2::Slice>,_std::_Select1st<std::pair<const_Imf_3_2::Name,_Imf_3_2::Slice>_>,_std::less<Imf_3_2::Name>,_std::allocator<std::pair<const_Imf_3_2::Name,_Imf_3_2::Slice>_>_>
    ::~_Rb_tree((_Rb_tree<Imf_3_2::Name,_std::pair<const_Imf_3_2::Name,_Imf_3_2::Slice>,_std::_Select1st<std::pair<const_Imf_3_2::Name,_Imf_3_2::Slice>_>,_std::less<Imf_3_2::Name>,_std::allocator<std::pair<const_Imf_3_2::Name,_Imf_3_2::Slice>_>_>
                 *)&s);
    if (data.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
        _M_start != (pointer)0x0) {
      operator_delete(data.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)data.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage -
                      (long)data.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                            super__Vector_impl_data._M_start);
    }
    Imf_3_2::InputFile::~InputFile((InputFile *)&counts);
  }
  remove(fn._M_dataplus._M_p);
  std::
  vector<std::vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>,_std::allocator<std::vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>_>_>
  ::~vector(&main._samples);
  std::
  vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
  ::~vector(&main._current_pixel);
  if (main._current_sample.super__Vector_base<float,_std::allocator<float>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(main._current_sample.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)main._current_sample.super__Vector_base<float,_std::allocator<float>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)main._current_sample.super__Vector_base<float,_std::allocator<float>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  std::
  vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
  ::~vector(&main._results);
  if (main._current_result.super__Vector_base<float,_std::allocator<float>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(main._current_result.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)main._current_result.super__Vector_base<float,_std::allocator<float>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)main._current_result.super__Vector_base<float,_std::allocator<float>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&main._channels);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)fn._M_dataplus._M_p != &fn.field_2) {
    operator_delete(fn._M_dataplus._M_p,fn.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void
test_parts (
    int                pattern_number,
    int                number_of_parts,
    bool               load_depths,
    bool               entire_buffer,
    const std::string& tempDir)
{
    std::string fn = tempDir + "imf_test_composite_deep_scanline_source.exr";

    data<T> main;
    make_pattern (main, pattern_number);
    write_file (fn.c_str (), main, number_of_parts);

    {
        vector<T>                      data;
        CompositeDeepScanLine          comp;
        FrameBuffer                    testbuf;
        MultiPartInputFile             input (fn.c_str ());
        vector<DeepScanLineInputPart*> parts (number_of_parts);

        // use 'part' interface TODO test file interface too
        for (int i = 0; i < number_of_parts; i++)
        {
            parts[i] = new DeepScanLineInputPart (input, i);
            comp.addSource (parts[i]);
        }

        main.setUpFrameBuffer (
            data, testbuf, comp.dataWindow (), load_depths);

        comp.setFrameBuffer (testbuf);

        //
        // try loading the whole buffer
        //
        if (entire_buffer)
        {
            comp.readPixels (
                comp.dataWindow ().min.y, comp.dataWindow ().max.y);
        }
        else
        {
            int low = comp.dataWindow ().min.y;
            while (low < comp.dataWindow ().max.y)
            {
                int high = low + random_int (64);
                if (high > comp.dataWindow ().max.y)
                    high = comp.dataWindow ().max.y;
                comp.readPixels (low, high);
                low = high;
            }
        }

        main.checkValues (data, comp.dataWindow (), load_depths);

        for (int i = 0; i < number_of_parts; i++)
        {
            delete parts[i];
        }
    }
    if (number_of_parts == 1)
    {
        // also test InputFile interface
        InputFile    file (fn.c_str ());
        vector<T>    data;
        FrameBuffer  testbuf;
        const Box2i& dataWindow = file.header ().dataWindow ();
        main.setUpFrameBuffer (data, testbuf, dataWindow, load_depths);
        file.setFrameBuffer (testbuf);
        if (entire_buffer)
        {
            file.readPixels (dataWindow.min.y, dataWindow.max.y);
        }
        else
        {
            int low = dataWindow.min.y;
            while (low < dataWindow.max.y)
            {
                int high = low + random_int (64);
                if (high > dataWindow.max.y) high = dataWindow.max.y;
                file.readPixels (low, high);
                low = high;
            }
        }

        main.checkValues (data, dataWindow, load_depths);
    }
    remove (fn.c_str ());
}